

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

QByteArray * composePreprocessorOutput(QByteArray *__return_storage_ptr__,Symbols *symbols)

{
  qsizetype *pqVar1;
  Symbol *pSVar2;
  Data *pDVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  qsizetype n;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long in_FS_OFFSET;
  Symbol sym;
  int local_ac;
  QByteArray local_98;
  QByteArray local_80;
  ulong local_68;
  QByteArray QStack_60;
  qsizetype local_48;
  qsizetype qStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((symbols->d).size != 0) {
    local_ac = 1;
    uVar8 = 0;
    lVar9 = 0x20;
    iVar7 = 0;
    uVar5 = 0;
    do {
      pSVar2 = (symbols->d).ptr;
      local_68 = *(ulong *)((long)pSVar2 + lVar9 + -0x20);
      QStack_60.d.d = *(Data **)((long)pSVar2 + lVar9 + -0x18);
      QStack_60.d.ptr = *(char **)((long)pSVar2 + lVar9 + -0x10);
      QStack_60.d.size = *(qsizetype *)((long)pSVar2 + lVar9 + -8);
      if (&(QStack_60.d.d)->super_QArrayData == (QArrayData *)0x0) {
        uVar6 = local_68 >> 0x20;
      }
      else {
        LOCK();
        ((QStack_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((QStack_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        uVar6 = local_68 >> 0x20;
      }
      pqVar1 = (qsizetype *)((long)&pSVar2->lineNum + lVar9);
      local_48 = *pqVar1;
      qStack_40 = pqVar1[1];
      iVar4 = (int)uVar6;
      iVar10 = (int)uVar5;
      if (iVar4 < 0xa4) {
        if (iVar4 == 4) {
          n = 1;
          if ((iVar10 != 4) && (n = 2, iVar10 != 0xa5 || iVar7 != 4)) goto LAB_00115cd4;
          QByteArray::chop(__return_storage_ptr__,n);
          QByteArray::mid(&local_98,&QStack_60,local_48,qStack_40);
          QByteArray::mid(&local_80,&local_98,1,-1);
          QByteArray::append(__return_storage_ptr__,&local_80);
          if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
            }
          }
          uVar5 = 4;
          iVar7 = iVar10;
        }
        else if (iVar4 == 0x99) {
          local_ac = 0;
        }
        else {
          if (iVar4 != 0x9a) goto LAB_00115cd4;
          local_ac = (int)local_68;
        }
      }
      else if (iVar4 - 0xa4U < 2) {
        uVar5 = 0xa5;
        if (iVar10 != 0xa5) {
          QByteArray::append(__return_storage_ptr__,' ');
          iVar7 = iVar10;
        }
      }
      else {
LAB_00115cd4:
        if ((int)local_68 - local_ac != 0 && local_ac <= (int)local_68) {
          uVar5 = (ulong)(uint)((int)local_68 - local_ac);
          QByteArray::resize(__return_storage_ptr__,(__return_storage_ptr__->d).size + uVar5);
          pDVar3 = (__return_storage_ptr__->d).d;
          if ((pDVar3 == (Data *)0x0) ||
             (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QByteArray::reallocData
                      (__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
          }
          memset((__return_storage_ptr__->d).ptr + ((__return_storage_ptr__->d).size - uVar5),10,
                 uVar5);
          local_ac = (int)local_68;
        }
        QByteArray::mid(&local_80,&QStack_60,local_48,qStack_40);
        QByteArray::append(__return_storage_ptr__,&local_80);
        uVar5 = uVar6;
        iVar7 = iVar10;
        if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      if (&(QStack_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((QStack_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((QStack_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((QStack_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(QStack_60.d.d)->super_QArrayData,1,0x10);
        }
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x30;
    } while (uVar8 < (ulong)(symbols->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray composePreprocessorOutput(const Symbols &symbols) {
    QByteArray output;
    int lineNum = 1;
    Token last = PP_NOTOKEN;
    Token secondlast = last;
    int i = 0;
    while (hasNext(symbols, i)) {
        Symbol sym = next(symbols, i);
        switch (sym.token) {
        case PP_NEWLINE:
        case PP_WHITESPACE:
            if (last != PP_WHITESPACE) {
                secondlast = last;
                last = PP_WHITESPACE;
                output += ' ';
            }
            continue;
        case PP_STRING_LITERAL:
            if (last == PP_STRING_LITERAL)
                output.chop(1);
            else if (secondlast == PP_STRING_LITERAL && last == PP_WHITESPACE)
                output.chop(2);
            else
                break;
            output += sym.lexem().mid(1);
            secondlast = last;
            last = PP_STRING_LITERAL;
            continue;
        case MOC_INCLUDE_BEGIN:
            lineNum = 0;
            continue;
        case MOC_INCLUDE_END:
            lineNum = sym.lineNum;
            continue;
        default:
            break;
        }
        secondlast = last;
        last = sym.token;

        const int padding = sym.lineNum - lineNum;
        if (padding > 0) {
            output.resize(output.size() + padding);
            memset(output.data() + output.size() - padding, '\n', padding);
            lineNum = sym.lineNum;
        }

        output += sym.lexem();
    }

    return output;
}